

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
* processRequestParameters_abi_cxx11_
            (pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
             *__return_storage_ptr__,string_view target,string_view body)

{
  long lVar1;
  undefined1 *puVar2;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *this;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  char __c;
  void *pvVar7;
  ulong uVar8;
  reference pbVar9;
  string_type *psVar10;
  ulong uVar11;
  mapped_type *this_00;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  size_type __n;
  ulong uVar15;
  _Base_ptr p_Var16;
  basic_string_view<char,_std::char_traits<char>_> *pbVar17;
  pointer pbVar18;
  string_view jsonString;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parameters;
  json val;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __begin3;
  iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  __end3;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> *local_1b8;
  iterator iStack_1b0;
  basic_string_view<char,_std::char_traits<char>_> *local_1a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  *local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  data local_188;
  undefined1 local_178 [32];
  size_t local_158;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *local_108;
  basic_string_view<char,_std::char_traits<char>_> *local_100;
  basic_string_view<char,_std::char_traits<char>_> *local_f8;
  ulong local_f0;
  undefined1 local_e8 [32];
  string local_c8;
  iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_a8;
  undefined1 local_a0 [112];
  
  local_198._M_str = body._M_str;
  local_198._M_len = body._M_len;
  pcVar14 = target._M_str;
  uVar11 = target._M_len;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->first)._M_len = 0;
  (__return_storage_ptr__->first)._M_str = (char *)0x0;
  (__return_storage_ptr__->second).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  local_1c8._M_len = uVar11;
  local_1c8._M_str = pcVar14;
  local_1a0 = __return_storage_ptr__;
  if (uVar11 == 0) {
    uVar13 = 0xffffffffffffffff;
  }
  else {
    pvVar7 = memchr(pcVar14,0x3f,uVar11);
    uVar13 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar14;
  }
  if (uVar13 == 0xffffffffffffffff) {
    (local_1a0->first)._M_len = local_1c8._M_len;
    (local_1a0->first)._M_str = local_1c8._M_str;
    local_1c8._M_len = 0;
    local_1c8._M_str = (char *)0x0;
  }
  else {
    uVar8 = uVar13;
    if (uVar11 < uVar13) {
      uVar8 = uVar11;
    }
    (local_1a0->first)._M_len = uVar8;
    (local_1a0->first)._M_str = pcVar14;
    lVar1 = uVar13 + 1;
    if (uVar11 <= uVar13) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,uVar11);
    }
    local_1c8._M_len = uVar11 - lVar1;
    local_1c8._M_str = pcVar14 + lVar1;
  }
  pcVar14 = local_1c8._M_str;
  sVar3 = (local_1a0->first)._M_len;
  if ((sVar3 != 0) && (pcVar4 = (local_1a0->first)._M_str, *pcVar4 == '/')) {
    (local_1a0->first)._M_str = pcVar4 + 1;
    (local_1a0->first)._M_len = sVar3 - 1;
  }
  local_1b8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  iStack_1b0._M_current = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  local_1a8 = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
  if ((pointer)local_1c8._M_len != (pointer)0x0) {
    pvVar7 = memchr(local_1c8._M_str,0x26,local_1c8._M_len);
    pbVar18 = (pointer)((long)pvVar7 - (long)pcVar14);
    if (pbVar18 != (pointer)0xffffffffffffffff && pvVar7 != (void *)0x0) {
      do {
        local_178._0_8_ = local_1c8._M_len;
        if (pbVar18 <= local_1c8._M_len) {
          local_178._0_8_ = pbVar18;
        }
        local_178._8_8_ = local_1c8._M_str;
        uVar5 = local_178._8_8_;
        if (iStack_1b0._M_current == local_1a8) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&local_1b8,iStack_1b0,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_178);
        }
        else {
          local_178._4_4_ = (undefined4)((ulong)local_178._0_8_ >> 0x20);
          local_178._8_4_ = SUB84(local_1c8._M_str,0);
          local_178._12_4_ = (undefined4)((ulong)local_1c8._M_str >> 0x20);
          *(undefined4 *)&(iStack_1b0._M_current)->_M_len = local_178._0_4_;
          *(undefined4 *)((long)&(iStack_1b0._M_current)->_M_len + 4) = local_178._4_4_;
          *(undefined4 *)&(iStack_1b0._M_current)->_M_str = local_178._8_4_;
          *(undefined4 *)((long)&(iStack_1b0._M_current)->_M_str + 4) = local_178._12_4_;
          iStack_1b0._M_current = iStack_1b0._M_current + 1;
          local_178._8_8_ = uVar5;
        }
        puVar2 = &(pbVar18->m_data).field_0x1;
        if (local_1c8._M_len <= pbVar18) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        p_Var16 = (_Base_ptr)(puVar2 + (long)(_Rb_tree_color *)local_1c8._M_str);
        pbVar18 = (pointer)0xffffffffffffffff;
        local_1c8._M_len = local_1c8._M_len - (long)puVar2;
        local_1c8._M_str = (char *)p_Var16;
        if ((pointer)local_1c8._M_len != (pointer)0x0) {
          pvVar7 = memchr(p_Var16,0x26,local_1c8._M_len);
          pbVar18 = (pointer)(-(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)p_Var16);
        }
      } while (pbVar18 != (pointer)0xffffffffffffffff);
    }
    if ((pointer)local_1c8._M_len != (pointer)0x0) {
      if (iStack_1b0._M_current == local_1a8) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_1b8,iStack_1b0,&local_1c8);
      }
      else {
        (iStack_1b0._M_current)->_M_len = local_1c8._M_len;
        (iStack_1b0._M_current)->_M_str = local_1c8._M_str;
        iStack_1b0._M_current = iStack_1b0._M_current + 1;
      }
    }
  }
  pcVar14 = local_198._M_str;
  if ((pointer)local_198._M_len != (pointer)0x0) {
    if ((char)*(_Rb_tree_color *)local_198._M_str == 0x7b) {
      jsonString._M_str = (char *)local_198._M_len;
      jsonString._M_len = (size_t)&local_188;
      helics::fileops::loadJsonStr_abi_cxx11_(jsonString);
      local_a8.container = (pointer)&local_188;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::begin((iterator *)local_a0,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)&local_188);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_178,(iterator *)local_a0,0);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             *)local_a0,&local_a8);
      this = &local_1a0->second;
      while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::
                     operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                               ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                 *)local_178,(iterator *)local_a0), !bVar6) {
        pbVar9 = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)local_178);
        if ((pbVar9->m_data).m_type == string) {
          pbVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)local_178);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_e8,pbVar9);
          psVar10 = nlohmann::json_abi_v3_11_3::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           *)local_178);
          boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::priv_subscript(this,psVar10);
          processRequestParameters_abi_cxx11_();
        }
        else {
          pbVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)local_178);
          helics::fileops::generateJsonString(&local_c8,pbVar9,true);
          psVar10 = nlohmann::json_abi_v3_11_3::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           *)local_178);
          boost::container::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          ::priv_subscript(this,psVar10);
          processRequestParameters_abi_cxx11_();
        }
        if (*(char *)local_178._0_8_ == '\x02') {
          local_178._16_8_ = local_178._16_8_ + 0x10;
        }
        else if (*(char *)local_178._0_8_ == '\x01') {
          local_178._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_178._8_8_);
        }
        else {
          local_178._24_8_ = local_178._24_8_ + 1;
        }
        local_158 = local_158 + 1;
      }
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_a0);
      nlohmann::json_abi_v3_11_3::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  *)local_178);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_188);
    }
    else {
      pvVar7 = memchr(local_198._M_str,0x26,local_198._M_len);
      pbVar18 = (pointer)((long)pvVar7 - (long)pcVar14);
      if (pbVar18 != (pointer)0xffffffffffffffff && pvVar7 != (void *)0x0) {
        do {
          local_178._0_8_ = local_198._M_len;
          if (pbVar18 <= local_198._M_len) {
            local_178._0_8_ = pbVar18;
          }
          local_178._8_8_ = local_198._M_str;
          uVar5 = local_178._8_8_;
          if (iStack_1b0._M_current == local_1a8) {
            std::
            vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                      ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                        *)&local_1b8,iStack_1b0,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_178);
          }
          else {
            local_178._4_4_ = (undefined4)((ulong)local_178._0_8_ >> 0x20);
            local_178._8_4_ = SUB84(local_198._M_str,0);
            local_178._12_4_ = (undefined4)((ulong)local_198._M_str >> 0x20);
            *(undefined4 *)&(iStack_1b0._M_current)->_M_len = local_178._0_4_;
            *(undefined4 *)((long)&(iStack_1b0._M_current)->_M_len + 4) = local_178._4_4_;
            *(undefined4 *)&(iStack_1b0._M_current)->_M_str = local_178._8_4_;
            *(undefined4 *)((long)&(iStack_1b0._M_current)->_M_str + 4) = local_178._12_4_;
            iStack_1b0._M_current = iStack_1b0._M_current + 1;
            local_178._8_8_ = uVar5;
          }
          puVar2 = &(pbVar18->m_data).field_0x1;
          if (local_198._M_len <= pbVar18) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr");
          }
          p_Var16 = (_Base_ptr)(puVar2 + (long)(_Rb_tree_color *)local_198._M_str);
          pbVar18 = (pointer)0xffffffffffffffff;
          local_198._M_len = local_198._M_len - (long)puVar2;
          local_198._M_str = (char *)p_Var16;
          if ((pointer)local_198._M_len != (pointer)0x0) {
            pvVar7 = memchr(p_Var16,0x26,local_198._M_len);
            pbVar18 = (pointer)(-(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)p_Var16);
          }
        } while (pbVar18 != (pointer)0xffffffffffffffff);
      }
      if ((pointer)local_198._M_len != (pointer)0x0) {
        if (iStack_1b0._M_current == local_1a8) {
          std::
          vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                    ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)&local_1b8,iStack_1b0,&local_198);
        }
        else {
          (iStack_1b0._M_current)->_M_len = local_198._M_len;
          (iStack_1b0._M_current)->_M_str = local_198._M_str;
          iStack_1b0._M_current = iStack_1b0._M_current + 1;
        }
      }
    }
  }
  local_100 = iStack_1b0._M_current;
  if (local_1b8 != iStack_1b0._M_current) {
    local_108 = &local_1a0->second;
    pbVar17 = local_1b8;
    do {
      uVar11 = 0xffffffffffffffff;
      if (pbVar17->_M_len != 0) {
        pcVar14 = pbVar17->_M_str;
        pvVar7 = memchr(pcVar14,0x3d,pbVar17->_M_len);
        uVar11 = -(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)pcVar14;
      }
      uVar13 = uVar11 + 1;
      uVar8 = pbVar17->_M_len;
      local_f0 = uVar11;
      if (uVar8 < uVar13) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar13,uVar8);
      }
      pcVar14 = pbVar17->_M_str;
      local_178._0_8_ = local_178 + 0x10;
      local_178._8_8_ = (_Base_ptr)0x0;
      local_178._16_8_ = local_178._16_8_ & 0xffffffffffffff00;
      local_f8 = pbVar17;
      if (uVar8 != uVar13) {
        uVar15 = 0;
        do {
          __c = pcVar14[uVar15 + uVar13];
          if (__c == '%') {
            local_188.m_type = pcVar14[uVar15 + uVar11 + 2];
            local_188._1_1_ = pcVar14[uVar15 + uVar11 + 3];
            local_188._2_1_ = 0;
            local_a0._0_8_ = (pointer)0x0;
            uVar12 = strtoul((char *)&local_188,(char **)local_a0,0x10);
            if (local_a0._0_8_ - (long)&local_188 < 2) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_178,pcVar14[uVar15 + uVar13]);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_178,(char)uVar12);
              uVar15 = uVar15 + 2;
            }
          }
          else {
            if (__c == '+') {
              __c = ' ';
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178
                      ,__c);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < uVar8 - uVar13);
      }
      pbVar17 = local_f8;
      uVar11 = local_f0;
      if (local_f8->_M_len < local_f0) {
        uVar11 = local_f8->_M_len;
      }
      local_a0._0_8_ = (pointer)(local_a0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,local_f8->_M_str,local_f8->_M_str + uVar11);
      this_00 = boost::container::
                flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                ::priv_subscript(local_108,(key_type *)local_a0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_178);
      if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
      }
      if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != local_100);
  }
  if (local_1b8 != (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  return local_1a0;
}

Assistant:

static std::pair<std::string_view, boost::container::flat_map<std::string, std::string>>
    processRequestParameters(std::string_view target, std::string_view body)
{
    std::pair<std::string_view, boost::container::flat_map<std::string, std::string>> results;
    auto param_mark = target.find('?');
    if (param_mark != std::string_view::npos) {
        results.first = target.substr(0, param_mark);
        target = target.substr(param_mark + 1);
    } else {
        results.first = target;
        target = std::string_view{};
    }
    if (!results.first.empty() && results.first.front() == '/') {
        results.first.remove_prefix(1);
    }

    std::vector<std::string_view> parameters;
    if (!target.empty()) {
        auto splitloc = target.find_first_of('&');
        while (splitloc != std::string_view::npos) {
            parameters.push_back(target.substr(0, splitloc));
            target = target.substr(splitloc + 1);
            splitloc = target.find_first_of('&');
        }
        if (!target.empty()) {
            parameters.push_back(target);
        }
    }
    if (!body.empty()) {
        if (body.front() == '{') {
            nlohmann::json val = helics::fileops::loadJsonStr(body);
            for (const auto& value : val.items()) {
                if (value.value().is_string()) {
                    results.second[value.key()] = value.value().get<std::string>();
                } else {
                    results.second[value.key()] =
                        helics::fileops::generateJsonString(value.value());
                }
            }
        } else {
            auto splitloc = body.find_first_of('&');
            while (splitloc != std::string_view::npos) {
                parameters.push_back(body.substr(0, splitloc));
                body = body.substr(splitloc + 1);
                splitloc = body.find_first_of('&');
            }
            if (!body.empty()) {
                parameters.push_back(body);
            }
        }
    }

    for (auto& param : parameters) {
        auto eq_loc = param.find_first_of('=');
        results.second[std::string{param.substr(0, eq_loc)}] = uriDecode(param.substr(eq_loc + 1));
    }
    return results;
}